

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O0

void litter(void)

{
  obj *poVar1;
  boolean bVar2;
  int x;
  int iVar3;
  char *pcVar4;
  int capacity;
  obj *nextobj;
  obj *otmp;
  
  nextobj = invent;
  x = weight_cap();
  poVar1 = nextobj;
  while (nextobj = poVar1, nextobj != (obj *)0x0) {
    poVar1 = nextobj->nobj;
    if (((nextobj != uball) && (iVar3 = rnd(x), iVar3 <= (int)nextobj->owt)) &&
       (bVar2 = canletgo(nextobj,""), bVar2 != '\0')) {
      pcVar4 = aobjnam(nextobj,"follow");
      pline("Your %s you down the stairs.",pcVar4);
      dropx(nextobj);
    }
  }
  return;
}

Assistant:

static void litter(void)
{
	struct obj *otmp = invent, *nextobj;
	int capacity = weight_cap();

	while (otmp) {
		nextobj = otmp->nobj;
		if ((otmp != uball) && (rnd(capacity) <= (int)otmp->owt)) {
			if (canletgo(otmp, "")) {
				pline("Your %s you down the stairs.",
				     aobjnam(otmp, "follow"));
				dropx(otmp);
			}
		}
		otmp = nextobj;
	}
}